

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

BOOL objc_bitfield_test(uintptr_t bitfield,uint64_t field)

{
  uint uVar1;
  ulong uVar2;
  uint64_t bit;
  uint64_t byte;
  objc_bitfield *bf;
  uint64_t bit_1;
  uint64_t field_local;
  uintptr_t bitfield_local;
  
  if ((bitfield & 1) == 0) {
    if (field >> 5 < (ulong)(long)*(int *)bitfield) {
      uVar1 = 1 << ((byte)field & 0x1f);
      bitfield_local._7_1_ = (*(uint *)(bitfield + 4 + (field >> 5) * 4) & uVar1) == uVar1;
    }
    else {
      bitfield_local._7_1_ = false;
    }
  }
  else {
    uVar2 = (ulong)(1 << ((byte)field + 1 & 0x1f));
    bitfield_local._7_1_ = (bitfield & uVar2) == uVar2;
  }
  return bitfield_local._7_1_;
}

Assistant:

static inline BOOL objc_bitfield_test(uintptr_t bitfield, uint64_t field)
{
	if (bitfield & 1)
	{
		uint64_t bit = 1<<(field+1);
		return (bitfield & bit) == bit;
	}
	struct objc_bitfield *bf = (struct objc_bitfield*)bitfield;
	uint64_t byte = field / 32;
	if (byte >= bf->length)
	{
		return NO;
	}
	uint64_t bit = 1<<(field%32);
	return (bf->values[byte] & bit) == bit;
}